

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

uint strpool_internal_pow2ceil(uint v)

{
  uint uVar1;
  int iVar2;
  uint v_local;
  
  uVar1 = v - 1 >> 1 | v - 1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  iVar2 = (uVar1 >> 0x10 | uVar1) + 1;
  return (uint)(iVar2 == 0) + iVar2;
}

Assistant:

static STRPOOL_U32 strpool_internal_pow2ceil( STRPOOL_U32 v )
    {
    --v;
    v |= v >> 1;
    v |= v >> 2;
    v |= v >> 4;
    v |= v >> 8;
    v |= v >> 16;
    ++v;
    v += ( v == 0 );
    return v;
    }